

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::CuePoint::PayloadSize(CuePoint *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 in_RDI;
  uint64_t payload_size;
  uint64_t track_pos_size;
  uint64_t size;
  uint64 in_stack_ffffffffffffffe0;
  undefined8 local_10;
  
  uVar1 = EbmlElementSize(in_stack_ffffffffffffffe0,in_RDI);
  uVar2 = EbmlElementSize(in_stack_ffffffffffffffe0,in_RDI);
  local_10 = uVar2 + uVar1;
  if (((*(byte *)(in_RDI + 0x20) & 1) != 0) && (1 < *(ulong *)(in_RDI + 0x18))) {
    uVar1 = EbmlElementSize(in_stack_ffffffffffffffe0,in_RDI);
    local_10 = uVar1 + local_10;
  }
  uVar1 = EbmlMasterElementSize(in_stack_ffffffffffffffe0,in_RDI);
  uVar2 = EbmlElementSize(in_stack_ffffffffffffffe0,in_RDI);
  return uVar2 + uVar1 + local_10;
}

Assistant:

uint64_t CuePoint::PayloadSize() const {
  uint64_t size = EbmlElementSize(libwebm::kMkvCueClusterPosition,
                                  static_cast<uint64>(cluster_pos_));
  size += EbmlElementSize(libwebm::kMkvCueTrack, static_cast<uint64>(track_));
  if (output_block_number_ && block_number_ > 1)
    size += EbmlElementSize(libwebm::kMkvCueBlockNumber,
                            static_cast<uint64>(block_number_));
  const uint64_t track_pos_size =
      EbmlMasterElementSize(libwebm::kMkvCueTrackPositions, size) + size;
  const uint64_t payload_size =
      EbmlElementSize(libwebm::kMkvCueTime, static_cast<uint64>(time_)) +
      track_pos_size;

  return payload_size;
}